

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::~ConcurrentQueue(ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                   *this)

{
  ConcurrentQueueProducerTypelessBase *pCVar1;
  ProducerToken *pPVar2;
  ImplicitProducerHash *pIVar3;
  __pointer_type pBVar4;
  __pointer_type p;
  ProducerBase *pPVar5;
  __pointer_type __ptr;
  __pointer_type __ptr_00;
  
  p = (this->producerListTail)._M_b._M_p;
  while (p != (ProducerBase *)0x0) {
    pCVar1 = (p->super_ConcurrentQueueProducerTypelessBase).next;
    pPVar2 = (p->super_ConcurrentQueueProducerTypelessBase).token;
    pPVar5 = (ProducerBase *)&pCVar1[-1].token;
    if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      pPVar5 = (ProducerBase *)0x0;
    }
    if (pPVar2 != (ProducerToken *)0x0) {
      pPVar2->producer = (ConcurrentQueueProducerTypelessBase *)0x0;
    }
    ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
    ::
    destroy<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase>
              (p);
    p = pPVar5;
  }
  pIVar3 = (this->implicitProducerHash)._M_b._M_p;
  while (__ptr = pIVar3, __ptr != (__pointer_type)0x0) {
    pIVar3 = __ptr->prev;
    if (pIVar3 != (ImplicitProducerHash *)0x0) {
      free(__ptr);
    }
  }
  pBVar4 = (this->freeList).freeListHead._M_b._M_p;
  while (__ptr_00 = pBVar4, __ptr_00 != (__pointer_type)0x0) {
    pBVar4 = (__ptr_00->freeListNext)._M_b._M_p;
    if (__ptr_00->dynamicallyAllocated == true) {
      free(__ptr_00);
    }
  }
  free(this->initialBlockPool);
  return;
}

Assistant:

~ConcurrentQueue() {
    // Destroy producers
    auto ptr = producerListTail.load(std::memory_order_relaxed);
    while (ptr != nullptr) {
      auto next = ptr->next_prod();
      if (ptr->token != nullptr) {
        ptr->token->producer = nullptr;
      }
      destroy(ptr);
      ptr = next;
    }

    // Destroy implicit producer hash tables
    MOODYCAMEL_CONSTEXPR_IF(INITIAL_IMPLICIT_PRODUCER_HASH_SIZE != 0) {
      auto hash = implicitProducerHash.load(std::memory_order_relaxed);
      while (hash != nullptr) {
        auto prev = hash->prev;
        if (prev != nullptr) {  // The last hash is part of this object and was
                                // not allocated dynamically
          for (size_t i = 0; i != hash->capacity; ++i) {
            hash->entries[i].~ImplicitProducerKVP();
          }
          hash->~ImplicitProducerHash();
          (Traits::free)(hash);
        }
        hash = prev;
      }
    }

    // Destroy global free list
    auto block = freeList.head_unsafe();
    while (block != nullptr) {
      auto next = block->freeListNext.load(std::memory_order_relaxed);
      if (block->dynamicallyAllocated) {
        destroy(block);
      }
      block = next;
    }

    // Destroy initial free list
    destroy_array(initialBlockPool, initialBlockPoolSize);
  }